

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_table.cpp
# Opt level: O3

void __thiscall
InlineTable_WithMultipleKeys_Test::~InlineTable_WithMultipleKeys_Test
          (InlineTable_WithMultipleKeys_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(InlineTable, WithMultipleKeys) {
    std::istringstream input("key = {\"key\"=123,\tkey=345 , 123 = \t'value' } ");
    events_aggregator_t handler;

    loltoml::parse(input, handler);

    std::vector<sax_event_t> expected_events = {
        {sax_event_t::start_document},
        {sax_event_t::key, "key"},
        {sax_event_t::start_inline_table},
        {sax_event_t::key, "key"},
        {sax_event_t::integer, 123},
        {sax_event_t::key, "key"},
        {sax_event_t::integer, 345},
        {sax_event_t::key, "123"},
        {sax_event_t::string, "value"},
        {sax_event_t::finish_inline_table, 3},
        {sax_event_t::finish_document}
    };

    EXPECT_EQ(expected_events, handler.events);
}